

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int ncnn::reduction_op<ncnn::reduction_op_mul<float>,ncnn::reduction_op_mul<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  byte in_CL;
  byte in_DL;
  Mat *in_RSI;
  Mat *in_RDI;
  byte in_R8B;
  float in_XMM0_Da;
  float fVar3;
  int j_7;
  int i_13;
  float *outptr_1;
  float *ptr_10;
  int q_8;
  int i_12;
  float *ptr_9;
  int q_7;
  int j_6;
  float *mins_ptr_3;
  int q_6;
  int j_5;
  int i_11;
  float *mins_ptr_2;
  float *ptr_8;
  int q_5;
  Mat mins_1;
  int i_10;
  float *mins_ptr_1;
  int q_4;
  int j_4;
  float sum_8;
  int i_9;
  float *mins_ptr;
  float *ptr_7;
  int q_3;
  Mat mins;
  int j_3;
  float sum_7;
  int i_8;
  float *outptr;
  float *ptr_6;
  int q_2;
  int i_7;
  float sum_6;
  float *ptr_5;
  int q_1;
  int i_6;
  float sum_4;
  int i_5;
  float sum_5;
  float *ptr_4;
  int q;
  Mat sums_1;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j_2;
  float *ptr_3;
  int i_4;
  int j_1;
  float sum_3;
  float *ptr_2;
  int i_3;
  int i_2;
  float sum_1;
  int j;
  float sum_2;
  float *ptr_1;
  int i_1;
  Mat sums;
  int h;
  int w_1;
  int i;
  float sum;
  float *ptr;
  int w;
  int dims;
  size_t elemsize;
  reduction_op_mul<float> op2;
  reduction_op_mul<float> op;
  Allocator *in_stack_fffffffffffff928;
  Mat *in_stack_fffffffffffff930;
  int in_stack_fffffffffffff938;
  float in_stack_fffffffffffff93c;
  Mat *in_stack_fffffffffffff940;
  int in_stack_fffffffffffff948;
  int in_stack_fffffffffffff94c;
  Mat *in_stack_fffffffffffff950;
  Mat *in_stack_fffffffffffff958;
  int local_5f8;
  int local_5f4;
  Mat local_5e8;
  float *local_5a0;
  int local_598;
  int local_594;
  Mat local_590;
  float *local_548;
  int local_540;
  int local_53c;
  Mat local_538;
  Mat *local_4f0;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  Mat local_4d8;
  Mat *local_490;
  Mat local_488;
  float *local_440;
  int local_434;
  int local_3e4;
  Mat local_3e0;
  float *local_398;
  int local_390;
  int local_38c;
  float local_388;
  int local_384;
  Mat local_380;
  float *local_338;
  Mat local_330;
  float *local_2e8;
  int local_2dc;
  int local_28c;
  float local_288;
  int local_284;
  float *local_280;
  Mat local_278;
  float *local_230;
  int local_224;
  int local_220;
  float local_21c;
  Mat local_218;
  float *local_1d0;
  int local_1c4;
  int local_1c0;
  float local_1bc;
  int local_1b8;
  float local_1b4;
  Mat local_1b0;
  float *local_168;
  int local_15c;
  Mat local_158;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  float *local_f8;
  int local_ec;
  int local_e8;
  float local_e4;
  float *local_e0;
  int local_d4;
  int local_d0;
  float local_cc;
  int local_c8;
  float local_c4;
  float *local_c0;
  int local_b4;
  undefined4 local_b0;
  Mat local_a0;
  int local_58;
  int local_54;
  int local_50;
  float local_4c;
  float *local_48;
  int local_40;
  int local_3c;
  size_t local_38;
  reduction_op_mul<float> local_2a;
  reduction_op_mul<float> local_29 [10];
  byte local_1f;
  byte local_1e;
  byte local_1d;
  float local_1c;
  Mat *local_18;
  Mat *local_10;
  int local_4;
  
  local_1d = in_DL & 1;
  local_1e = in_CL & 1;
  local_1f = in_R8B & 1;
  local_38 = in_RDI->elemsize;
  local_3c = in_RDI->dims;
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (local_3c == 1) {
    local_40 = in_RDI->w;
    Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
                (size_t)in_stack_fffffffffffff940,
                (Allocator *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    local_48 = Mat::operator_cast_to_float_(local_10);
    local_4c = local_1c;
    for (local_50 = 0; fVar3 = local_4c, local_50 < local_40; local_50 = local_50 + 1) {
      local_4c = reduction_op_mul<float>::operator()(local_29,&local_4c,local_48 + local_50);
    }
    pfVar2 = Mat::operator[](local_18,0);
    *pfVar2 = fVar3;
    return 0;
  }
  if (local_3c == 2) {
    local_54 = in_RDI->w;
    local_58 = in_RDI->h;
    if ((local_1d != 0) && (local_1e != 0)) {
      Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
                  (size_t)in_stack_fffffffffffff940,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      Mat::Mat(in_stack_fffffffffffff940,(int)in_stack_fffffffffffff93c,
               (size_t)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      bVar1 = Mat::empty(in_stack_fffffffffffff930);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        for (local_b4 = 0; local_b4 < local_58; local_b4 = local_b4 + 1) {
          local_c0 = Mat::row(local_10,local_b4);
          local_c4 = local_1c;
          for (local_c8 = 0; fVar3 = local_c4, local_c8 < local_54; local_c8 = local_c8 + 1) {
            local_c4 = reduction_op_mul<float>::operator()(local_29,&local_c4,local_c0 + local_c8);
          }
          pfVar2 = Mat::operator[](&local_a0,(long)local_b4);
          *pfVar2 = fVar3;
        }
        local_cc = local_1c;
        for (local_d0 = 0; fVar3 = local_cc, local_d0 < local_58; local_d0 = local_d0 + 1) {
          pfVar2 = Mat::operator[](&local_a0,(long)local_d0);
          local_cc = reduction_op_mul<float>::operator()(&local_2a,&local_cc,pfVar2);
        }
        pfVar2 = Mat::operator[](local_18,0);
        *pfVar2 = fVar3;
        local_4 = 0;
      }
      local_b0 = 1;
      Mat::~Mat((Mat *)0x4e7209);
      return local_4;
    }
    if ((local_1d != 0) && (local_1e == 0)) {
      Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
                  (size_t)in_stack_fffffffffffff940,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      for (local_d4 = 0; local_d4 < local_58; local_d4 = local_d4 + 1) {
        local_e0 = Mat::row(local_10,local_d4);
        local_e4 = local_1c;
        for (local_e8 = 0; fVar3 = local_e4, local_e8 < local_54; local_e8 = local_e8 + 1) {
          local_e4 = reduction_op_mul<float>::operator()(local_29,&local_e4,local_e0 + local_e8);
        }
        pfVar2 = Mat::operator[](local_18,(long)local_d4);
        *pfVar2 = fVar3;
      }
      return 0;
    }
    if ((local_1d == 0) && (local_1e != 0)) {
      Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
                  (size_t)in_stack_fffffffffffff940,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      Mat::fill(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      for (local_ec = 0; local_ec < local_58; local_ec = local_ec + 1) {
        local_f8 = Mat::row(local_10,local_ec);
        for (local_fc = 0; local_fc < local_54; local_fc = local_fc + 1) {
          pfVar2 = Mat::operator[](local_18,(long)local_fc);
          fVar3 = reduction_op_mul<float>::operator()(local_29,pfVar2,local_f8 + local_fc);
          pfVar2 = Mat::operator[](local_18,(long)local_fc);
          *pfVar2 = fVar3;
        }
      }
      return 0;
    }
  }
  if (local_3c == 3) {
    local_100 = in_RDI->w;
    local_104 = in_RDI->h;
    local_108 = in_RDI->c;
    local_10c = local_100 * local_104;
    if (((local_1d != 0) && (local_1e != 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
                  (size_t)in_stack_fffffffffffff940,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      Mat::Mat(in_stack_fffffffffffff940,(int)in_stack_fffffffffffff93c,
               (size_t)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      bVar1 = Mat::empty(in_stack_fffffffffffff930);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        for (local_15c = 0; local_15c < local_108; local_15c = local_15c + 1) {
          Mat::channel(in_stack_fffffffffffff958,(int)((ulong)in_stack_fffffffffffff950 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_1b0);
          Mat::~Mat((Mat *)0x4e7650);
          local_1b4 = local_1c;
          local_168 = pfVar2;
          for (local_1b8 = 0; fVar3 = local_1b4, local_1b8 < local_10c; local_1b8 = local_1b8 + 1) {
            local_1b4 = reduction_op_mul<float>::operator()
                                  (local_29,&local_1b4,local_168 + local_1b8);
          }
          pfVar2 = Mat::operator[](&local_158,(long)local_15c);
          *pfVar2 = fVar3;
        }
        local_1bc = local_1c;
        for (local_1c0 = 0; fVar3 = local_1bc, local_1c0 < local_108; local_1c0 = local_1c0 + 1) {
          pfVar2 = Mat::operator[](&local_158,(long)local_1c0);
          local_1bc = reduction_op_mul<float>::operator()(&local_2a,&local_1bc,pfVar2);
        }
        pfVar2 = Mat::operator[](local_18,0);
        *pfVar2 = fVar3;
        local_4 = 0;
      }
      local_b0 = 1;
      Mat::~Mat((Mat *)0x4e77e8);
      return local_4;
    }
    if (((local_1d != 0) && (local_1e != 0)) && (local_1f == 0)) {
      Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
                  (size_t)in_stack_fffffffffffff940,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      for (local_1c4 = 0; local_1c4 < local_108; local_1c4 = local_1c4 + 1) {
        Mat::channel(in_stack_fffffffffffff958,(int)((ulong)in_stack_fffffffffffff950 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_218);
        Mat::~Mat((Mat *)0x4e789c);
        local_21c = local_1c;
        local_1d0 = pfVar2;
        for (local_220 = 0; fVar3 = local_21c, local_220 < local_10c; local_220 = local_220 + 1) {
          local_21c = reduction_op_mul<float>::operator()(local_29,&local_21c,local_1d0 + local_220)
          ;
        }
        pfVar2 = Mat::operator[](local_18,(long)local_1c4);
        *pfVar2 = fVar3;
      }
      return 0;
    }
    if (((local_1d != 0) && (local_1e == 0)) && (local_1f == 0)) {
      Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                  (size_t)in_stack_fffffffffffff940,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      for (local_224 = 0; local_224 < local_108; local_224 = local_224 + 1) {
        Mat::channel(in_stack_fffffffffffff958,(int)((ulong)in_stack_fffffffffffff950 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_278);
        Mat::~Mat((Mat *)0x4e7a31);
        local_230 = pfVar2;
        local_280 = Mat::row(local_18,local_224);
        for (local_284 = 0; local_284 < local_104; local_284 = local_284 + 1) {
          local_288 = local_1c;
          for (local_28c = 0; local_28c < local_100; local_28c = local_28c + 1) {
            local_288 = reduction_op_mul<float>::operator()
                                  (local_29,&local_288,local_230 + local_28c);
          }
          local_280[local_284] = local_288;
          local_230 = local_230 + local_100;
        }
      }
      return 0;
    }
    if (((local_1d != 0) && (local_1e == 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
                  (size_t)in_stack_fffffffffffff940,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      Mat::Mat(in_stack_fffffffffffff940,(int)in_stack_fffffffffffff93c,in_stack_fffffffffffff938,
               (int)((ulong)in_stack_fffffffffffff930 >> 0x20),(size_t)in_stack_fffffffffffff928,
               (Allocator *)0x4e7bf9);
      bVar1 = Mat::empty(in_stack_fffffffffffff930);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        Mat::fill(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        for (local_2dc = 0; local_2dc < local_108; local_2dc = local_2dc + 1) {
          Mat::channel(in_stack_fffffffffffff958,(int)((ulong)in_stack_fffffffffffff950 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_330);
          Mat::~Mat((Mat *)0x4e7cce);
          local_2e8 = pfVar2;
          Mat::channel(in_stack_fffffffffffff958,(int)((ulong)in_stack_fffffffffffff950 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_380);
          Mat::~Mat((Mat *)0x4e7d18);
          local_338 = pfVar2;
          for (local_384 = 0; local_384 < local_104; local_384 = local_384 + 1) {
            local_388 = local_1c;
            for (local_38c = 0; local_38c < local_100; local_38c = local_38c + 1) {
              local_388 = reduction_op_mul<float>::operator()
                                    (local_29,&local_388,local_2e8 + local_38c);
            }
            local_338[local_384] = local_388;
            local_2e8 = local_2e8 + local_100;
          }
        }
        Mat::fill(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        for (local_390 = 0; local_390 < local_108; local_390 = local_390 + 1) {
          Mat::channel(in_stack_fffffffffffff958,(int)((ulong)in_stack_fffffffffffff950 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_3e0);
          Mat::~Mat((Mat *)0x4e7e98);
          local_398 = pfVar2;
          for (local_3e4 = 0; local_3e4 < local_104; local_3e4 = local_3e4 + 1) {
            pfVar2 = Mat::operator[](local_18,(long)local_3e4);
            fVar3 = reduction_op_mul<float>::operator()(&local_2a,pfVar2,local_398 + local_3e4);
            pfVar2 = Mat::operator[](local_18,(long)local_3e4);
            *pfVar2 = fVar3;
          }
        }
        local_4 = 0;
      }
      local_b0 = 1;
      Mat::~Mat((Mat *)0x4e7f72);
      return local_4;
    }
    if (((local_1d == 0) && (local_1e != 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,
                  (size_t)in_stack_fffffffffffff940,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      Mat::Mat(in_stack_fffffffffffff940,(int)in_stack_fffffffffffff93c,in_stack_fffffffffffff938,
               (int)((ulong)in_stack_fffffffffffff930 >> 0x20),(size_t)in_stack_fffffffffffff928,
               (Allocator *)0x4e8002);
      bVar1 = Mat::empty(in_stack_fffffffffffff930);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        Mat::fill(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        for (local_434 = 0; local_434 < local_108; local_434 = local_434 + 1) {
          Mat::channel(in_stack_fffffffffffff958,(int)((ulong)in_stack_fffffffffffff950 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_488);
          Mat::~Mat((Mat *)0x4e80d1);
          local_440 = pfVar2;
          Mat::channel(in_stack_fffffffffffff958,(int)((ulong)in_stack_fffffffffffff950 >> 0x20));
          in_stack_fffffffffffff958 = (Mat *)Mat::operator_cast_to_float_(&local_4d8);
          Mat::~Mat((Mat *)0x4e811b);
          local_490 = in_stack_fffffffffffff958;
          for (local_4dc = 0; local_4dc < local_104; local_4dc = local_4dc + 1) {
            for (local_4e0 = 0; local_4e0 < local_100; local_4e0 = local_4e0 + 1) {
              fVar3 = reduction_op_mul<float>::operator()
                                (local_29,(float *)((long)&local_490->data + (long)local_4e0 * 4),
                                 local_440 + local_4e0);
              *(float *)((long)&local_490->data + (long)local_4e0 * 4) = fVar3;
            }
            local_440 = local_440 + local_100;
          }
        }
        Mat::fill(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
        for (local_4e4 = 0; local_4e4 < local_108; local_4e4 = local_4e4 + 1) {
          Mat::channel(in_stack_fffffffffffff958,(int)((ulong)in_stack_fffffffffffff950 >> 0x20));
          in_stack_fffffffffffff950 = (Mat *)Mat::operator_cast_to_float_(&local_538);
          Mat::~Mat((Mat *)0x4e8286);
          local_4f0 = in_stack_fffffffffffff950;
          for (local_53c = 0; local_53c < local_100; local_53c = local_53c + 1) {
            pfVar2 = Mat::operator[](local_18,(long)local_53c);
            fVar3 = reduction_op_mul<float>::operator()
                              (&local_2a,pfVar2,
                               (float *)((long)&local_4f0->data + (long)local_53c * 4));
            pfVar2 = Mat::operator[](local_18,(long)local_53c);
            *pfVar2 = fVar3;
          }
        }
        local_4 = 0;
      }
      local_b0 = 1;
      Mat::~Mat((Mat *)0x4e8360);
      return local_4;
    }
    if (((local_1d == 0) && (local_1e == 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                  (size_t)in_stack_fffffffffffff940,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      Mat::fill(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      for (local_540 = 0; local_540 < local_108; local_540 = local_540 + 1) {
        Mat::channel(in_stack_fffffffffffff958,(int)((ulong)in_stack_fffffffffffff950 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_590);
        Mat::~Mat((Mat *)0x4e842e);
        local_548 = pfVar2;
        for (local_594 = 0; local_594 < local_10c; local_594 = local_594 + 1) {
          pfVar2 = Mat::operator[](local_18,(long)local_594);
          fVar3 = reduction_op_mul<float>::operator()(local_29,pfVar2,local_548 + local_594);
          pfVar2 = Mat::operator[](local_18,(long)local_594);
          *pfVar2 = fVar3;
        }
      }
      return 0;
    }
    if (((local_1d == 0) && (local_1e != 0)) && (local_1f == 0)) {
      Mat::create(in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                  (size_t)in_stack_fffffffffffff940,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      Mat::fill(in_stack_fffffffffffff940,in_stack_fffffffffffff93c);
      for (local_598 = 0; local_598 < local_108; local_598 = local_598 + 1) {
        Mat::channel(in_stack_fffffffffffff958,(int)((ulong)in_stack_fffffffffffff950 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_5e8);
        Mat::~Mat((Mat *)0x4e85be);
        local_5a0 = pfVar2;
        pfVar2 = Mat::row(local_18,local_598);
        for (local_5f4 = 0; local_5f4 < local_104; local_5f4 = local_5f4 + 1) {
          for (local_5f8 = 0; local_5f8 < local_100; local_5f8 = local_5f8 + 1) {
            fVar3 = reduction_op_mul<float>::operator()
                              (local_29,pfVar2 + local_5f8,local_5a0 + local_5f8);
            pfVar2[local_5f8] = fVar3;
          }
          local_5a0 = local_5a0 + local_100;
        }
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i = 0; i < w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> X X
            b.create(1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i = 0; i < h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> X h
            b.create(h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }
            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w X
            b.create(w, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }
            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> X X X
            b.create(1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i = 0; i < channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> X X c
            b.create(channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                b[q] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> X h c
            b.create(h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> X h X
            b.create(h, elemsize, opt.blob_allocator);
            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i = 0; i < h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w X X
            b.create(w, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h X
            b.create(w, h, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i = 0; i < size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w X c
            b.create(w, channels, elemsize, opt.blob_allocator);

            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }
            return 0;
        }
    }

    return 0;
}